

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_trinary_func_op_bitextract
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op,BaseType expected_result_type,BaseType input_type0,
          BaseType input_type1,BaseType input_type2)

{
  bool bVar1;
  SPIRType *pSVar2;
  SPIRType *pSVar3;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  undefined1 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc1;
  undefined1 in_stack_fffffffffffffcc2;
  undefined1 in_stack_fffffffffffffcc3;
  bool forwarding;
  undefined4 in_stack_fffffffffffffcc4;
  string local_300;
  string local_2e0;
  string local_2c0 [32];
  undefined1 local_2a0 [8];
  string expr;
  string local_278;
  undefined1 local_258 [8];
  string cast_op2;
  string local_230;
  undefined1 local_210 [8];
  string cast_op1;
  string op2_expr;
  string op1_expr;
  undefined1 local_1a0 [8];
  string cast_op0;
  SPIRType expected_type;
  SPIRType *out_type;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,op2);
  pSVar2 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  SPIRType::SPIRType((SPIRType *)((long)&cast_op0.field_2 + 8),pSVar2);
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op0);
  if (pSVar3->basetype == input_type0) {
    to_unpacked_expression_abi_cxx11_((string *)local_1a0,this,op0,true);
  }
  else {
    bitcast_glsl_abi_cxx11_((string *)local_1a0,this,(SPIRType *)((long)&cast_op0.field_2 + 8),op0);
  }
  to_unpacked_expression_abi_cxx11_((string *)((long)&op2_expr.field_2 + 8),this,op1,true);
  to_unpacked_expression_abi_cxx11_((string *)((long)&cast_op1.field_2 + 8),this,op2,true);
  cast_op2.field_2._M_local_buf[0xf] = '\0';
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op1);
  if (pSVar3->basetype == input_type1) {
    ::std::__cxx11::string::string
              ((string *)local_210,(string *)(op2_expr.field_2._M_local_buf + 8));
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&local_230,this,(SPIRType *)((long)&cast_op0.field_2 + 8));
    cast_op2.field_2._M_local_buf[0xf] = '\x01';
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((string *)local_210,(diligent_spirv_cross *)&local_230,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe5b075,
               (char (*) [2])((long)&op2_expr.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,ts_3);
  }
  if ((cast_op2.field_2._M_local_buf[0xf] & 1U) != 0) {
    ::std::__cxx11::string::~string((string *)&local_230);
  }
  expr.field_2._M_local_buf[0xf] = '\0';
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op2);
  if (pSVar3->basetype == input_type2) {
    ::std::__cxx11::string::string
              ((string *)local_258,(string *)(cast_op1.field_2._M_local_buf + 8));
  }
  else {
    type_to_glsl_constructor_abi_cxx11_(&local_278,this,(SPIRType *)((long)&cast_op0.field_2 + 8));
    expr.field_2._M_local_buf[0xf] = '\x01';
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((string *)local_258,(diligent_spirv_cross *)&local_278,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe5b075,
               (char (*) [2])((long)&cast_op1.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,ts_3);
  }
  if ((expr.field_2._M_local_buf[0xf] & 1U) != 0) {
    ::std::__cxx11::string::~string((string *)&local_278);
  }
  ::std::__cxx11::string::string((string *)local_2a0);
  if (pSVar2->basetype == expected_result_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_300,(diligent_spirv_cross *)&op,(char **)0xe5b075,(char (*) [2])local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
               (char (*) [3])local_210,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
               (char (*) [3])local_258,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,
               (char (*) [2])
               CONCAT44(in_stack_fffffffffffffcc4,
                        CONCAT13(in_stack_fffffffffffffcc3,
                                 CONCAT12(in_stack_fffffffffffffcc2,
                                          CONCAT11(in_stack_fffffffffffffcc1,
                                                   in_stack_fffffffffffffcc0)))));
    ::std::__cxx11::string::operator+=((string *)local_2a0,(string *)&local_300);
    ::std::__cxx11::string::~string((string *)&local_300);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x3c])
              (local_2c0,this,pSVar2,(undefined1 *)((long)&cast_op0.field_2 + 8));
    ::std::__cxx11::string::operator=((string *)local_2a0,local_2c0);
    ::std::__cxx11::string::~string(local_2c0);
    ::std::__cxx11::string::operator+=((string *)local_2a0,'(');
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_2e0,(diligent_spirv_cross *)&op,(char **)0xe5b075,(char (*) [2])local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
               (char (*) [3])local_210,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf64f1c,
               (char (*) [3])local_258,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d,
               (char (*) [2])
               CONCAT44(in_stack_fffffffffffffcc4,
                        CONCAT13(in_stack_fffffffffffffcc3,
                                 CONCAT12(in_stack_fffffffffffffcc2,
                                          CONCAT11(in_stack_fffffffffffffcc1,
                                                   in_stack_fffffffffffffcc0)))));
    ::std::__cxx11::string::operator+=((string *)local_2a0,(string *)&local_2e0);
    ::std::__cxx11::string::~string((string *)&local_2e0);
    ::std::__cxx11::string::operator+=((string *)local_2a0,')');
  }
  bVar1 = should_forward(this,op0);
  forwarding = false;
  if (bVar1) {
    bVar1 = should_forward(this,op1);
    forwarding = false;
    if (bVar1) {
      forwarding = should_forward(this,op2);
    }
  }
  emit_op(this,result_type,result_id,(string *)local_2a0,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  ::std::__cxx11::string::~string((string *)local_2a0);
  ::std::__cxx11::string::~string((string *)local_258);
  ::std::__cxx11::string::~string((string *)local_210);
  ::std::__cxx11::string::~string((string *)(cast_op1.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(op2_expr.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)local_1a0);
  SPIRType::~SPIRType((SPIRType *)((long)&cast_op0.field_2 + 8));
  return;
}

Assistant:

void CompilerGLSL::emit_trinary_func_op_bitextract(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                                   uint32_t op2, const char *op,
                                                   SPIRType::BaseType expected_result_type,
                                                   SPIRType::BaseType input_type0, SPIRType::BaseType input_type1,
                                                   SPIRType::BaseType input_type2)
{
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type0;

	string cast_op0 =
	    expression_type(op0).basetype != input_type0 ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);

	auto op1_expr = to_unpacked_expression(op1);
	auto op2_expr = to_unpacked_expression(op2);

	// Use value casts here instead. Input must be exactly int or uint, but SPIR-V might be 16-bit.
	expected_type.basetype = input_type1;
	expected_type.vecsize = 1;
	string cast_op1 = expression_type(op1).basetype != input_type1 ?
	                      join(type_to_glsl_constructor(expected_type), "(", op1_expr, ")") :
	                      op1_expr;

	expected_type.basetype = input_type2;
	expected_type.vecsize = 1;
	string cast_op2 = expression_type(op2).basetype != input_type2 ?
	                      join(type_to_glsl_constructor(expected_type), "(", op2_expr, ")") :
	                      op2_expr;

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.vecsize = out_type.vecsize;
		expected_type.basetype = expected_result_type;
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1) && should_forward(op2));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
}